

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O3

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_func
          (Global_Var_to_Local *this,MirFunction *func,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *global_vars)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  int iVar3;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  key_type local_50;
  
  if (((global_vars->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     ((func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var1 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = p_Var1[3]._M_parent;
    p_Var1 = p_Var1[3]._M_left;
    if (p_Var6 != p_Var1) {
      do {
        iVar3 = (**(code **)(**(long **)p_Var6 + 8))();
        if ((iVar3 == 2) && (*(char *)(*(long *)p_Var6 + 0x38) == '\x01')) {
          pvVar4 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                             ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(*(long *)p_Var6 + 0x18));
          pcVar2 = (pvVar4->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + pvVar4->_M_string_length);
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&global_vars->_M_t,&local_50);
          if ((_Rb_tree_header *)cVar5._M_node != &(global_vars->_M_t)._M_impl.super__Rb_tree_header
             ) {
            pVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::equal_range(&global_vars->_M_t,&local_50);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_aux(&global_vars->_M_t,(_Base_ptr)pVar7.first._M_node,
                           (_Base_ptr)pVar7.second._M_node);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
      } while (p_Var6 != p_Var1);
    }
  }
  return;
}

Assistant:

void Global_Var_to_Local::optimize_func(mir::inst::MirFunction& func,
                                        std::set<std::string>& global_vars) {
  if (!global_vars.size() || !func.basic_blks.size()) {
    return;
  }
  auto& insts = func.basic_blks.begin()->second.inst;
  for (auto& inst : insts) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref) {
      auto& i = *inst;
      auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
      if (ref->val.index() == 1) {
        auto s = std::get<std::string>(ref->val);
        if (global_vars.count(s)) {
          global_vars.erase(s);
        }
      }
    }
  }
}